

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

pool_ref<soul::AST::Function> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::Function>
          (RewritingASTVisitor *this,pool_ref<soul::AST::Function> *o)

{
  bool condition;
  Function *pFVar1;
  pool_ref<soul::AST::Function> *in_RDX;
  ASTObject *result;
  pool_ref<soul::AST::Function> *o_local;
  RewritingASTVisitor *this_local;
  
  pFVar1 = pool_ref<soul::AST::Function>::getReference(in_RDX);
  pFVar1 = (Function *)visitObject((RewritingASTVisitor *)o,&pFVar1->super_ASTObject);
  condition = is_type<soul::AST::Function,soul::AST::ASTObject>((ASTObject *)pFVar1);
  checkAssertion(condition,"is_type<Type> (result)","visitAs",0x1d5);
  pool_ref<soul::AST::Function>::pool_ref<soul::AST::Function,void>
            ((pool_ref<soul::AST::Function> *)this,pFVar1);
  return (pool_ref<soul::AST::Function>)(Function *)this;
}

Assistant:

pool_ref<Type> visitAs (pool_ref<Type> o)
    {
        auto& result = visitObject (o.getReference());
        SOUL_ASSERT (is_type<Type> (result));
        return static_cast<Type&> (result);
    }